

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O1

Value * __thiscall
wabt::Decompiler::DecompileExpr(Value *__return_storage_ptr__,Decompiler *this,Node *n,Node *parent)

{
  char cVar1;
  ExprType EVar2;
  Opcode OVar3;
  Address AVar4;
  pointer pNVar5;
  Var *pVVar6;
  pointer pcVar7;
  size_t sVar8;
  Module *pMVar9;
  Func *pFVar10;
  VarExpr<(wabt::ExprType)24> *ve;
  const_iterator cVar11;
  Expr *pEVar12;
  pointer pbVar13;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view postfix;
  string_view postfix_00;
  string_view postfix_01;
  string_view prefix;
  string_view prefix_00;
  string_view infix;
  string_view prefix_01;
  ModuleContext *pMVar14;
  pointer child;
  Value *__return_storage_ptr___00;
  int iVar15;
  Type TVar16;
  long *plVar17;
  mapped_type *pmVar18;
  undefined8 *puVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  Expr *pEVar21;
  uint *args_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  Module *pMVar23;
  Expr *pEVar24;
  char *pcVar25;
  Decompiler *pDVar26;
  ulong uVar27;
  uint uVar28;
  long lVar29;
  char *pcVar30;
  _Alloc_hider _Var31;
  pointer pLVar32;
  char (*in_R8) [4];
  size_type sVar33;
  pointer pLVar34;
  Precedence PVar35;
  string_view *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_2;
  pointer pbVar36;
  Node *c;
  pointer n_00;
  ulong uVar37;
  Value *val;
  Var *v;
  Func *pFVar38;
  pointer pbVar39;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool bVar40;
  string_view sVar41;
  string_view prefix_02;
  string_view prefix_03;
  string_view y;
  string_view prefix_04;
  string_view infix_00;
  string_view first_indent;
  string decls;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> args;
  char *jmp;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  undefined4 uVar42;
  undefined1 local_198 [32];
  undefined1 local_178 [16];
  string_view local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  Decompiler *local_140;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> local_138;
  Node *local_118;
  Value *local_110;
  string local_108;
  char *local_e8;
  undefined8 uStack_e0;
  char *local_d8;
  undefined8 uStack_d0;
  char *local_c8;
  undefined8 uStack_c0;
  char *local_b8;
  undefined8 uStack_b0;
  char *local_a8;
  undefined8 uStack_a0;
  char *local_98;
  undefined8 uStack_90;
  char *local_88;
  undefined8 uStack_80;
  char *local_78;
  undefined8 uStack_70;
  char *local_68;
  undefined8 uStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  pointer pbStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_138.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  n_00 = (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
         super__Vector_impl_data._M_start;
  pNVar5 = (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_140 = (Decompiler *)parent;
  local_110 = __return_storage_ptr__;
  if (n_00 != pNVar5) {
    do {
      DecompileExpr((Value *)local_198,this,n_00,n);
      std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
      emplace_back<wabt::Decompiler::Value>(&local_138,(Value *)local_198);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_198);
      n_00 = n_00 + 1;
    } while (n_00 != pNVar5);
  }
  __return_storage_ptr___00 = local_110;
  child = local_138.
          super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
          _M_impl.super__Vector_impl_data._M_start;
  args_1 = &switchD_0014abf5::switchdataD_001aae60;
  switch(n->ntype) {
  case Uninitialized:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/decompiler.cc"
                  ,0x18a,"Value wabt::Decompiler::DecompileExpr(const Node &, const Node *)");
  case FlushToVars:
    local_198._0_8_ = local_198 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"let ","");
    if ((n->u).field_0.var_count != 0) {
      uVar28 = 0;
      do {
        if (uVar28 != 0) {
          std::__cxx11::string::append(local_198);
        }
        TempVarName_abi_cxx11_((string *)&local_168,this,(n->u).field_0.var_start + uVar28);
        std::__cxx11::string::_M_append(local_198,(ulong)local_168.data_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168.data_ != &local_158) {
          operator_delete(local_168.data_);
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 < (n->u).field_0.var_count);
    }
    std::__cxx11::string::append(local_198);
    prefix.size_ = local_198._8_8_;
    prefix.data_ = (char *)local_198._0_8_;
    local_68 = "";
    uStack_60 = 0;
    WrapNAry(__return_storage_ptr___00,this,&local_138,prefix,(string_view)ZEXT816(0x1ab201),Assign)
    ;
    goto LAB_0014afd3;
  case FlushedVar:
    TempVarName_abi_cxx11_((string *)local_198,this,(n->u).field_0.var_start);
LAB_0014aed7:
    local_168 = (string_view)ZEXT816(0);
    local_158._M_allocated_capacity = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
               local_198,local_178);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_168);
    __return_storage_ptr___00->precedence = Atomic;
LAB_0014af13:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_168);
LAB_0014afd3:
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_198 + 0x10);
    _Var31._M_p = (pointer)local_198._0_8_;
    goto LAB_0014afd8;
  case Statements:
    local_198._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_198._8_8_ = (pointer)0x0;
    local_198._16_8_ = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_110->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_198);
    __return_storage_ptr___00->precedence = None;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_198);
    if ((n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar37 = 0;
      do {
        pEVar21 = ((intrusive_list_base<wabt::Expr> *)
                  &((ModuleContext *)
                   &(local_138.
                     super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                     ._M_impl.super__Vector_impl_data._M_start)->v)->current_func_)[uVar37 * 2].
                  next_;
        cVar1 = *(char *)((pEVar21[-1].loc.filename.size_ - 1) +
                         pEVar21[-1].loc.field_1.field_1.offset);
        if ((cVar1 != ':') && (cVar1 != '}')) {
          std::__cxx11::string::push_back((char)pEVar21 + -0x20);
        }
        pMVar23 = (&((ModuleContext *)
                    &(local_138.
                      super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                      ._M_impl.super__Vector_impl_data._M_start)->v)->module)[uVar37 * 4];
        lVar29 = (long)((intrusive_list_base<wabt::Expr> *)
                       &((ModuleContext *)
                        &(local_138.
                          super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start)->v)->current_func_)[uVar37 * 2]
                       .next_ - (long)pMVar23 >> 5;
        if (0 < lVar29) {
          lVar29 = lVar29 + 1;
          do {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       __return_storage_ptr___00,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pMVar23)
            ;
            pMVar23 = (Module *)&pMVar23->name;
            lVar29 = lVar29 + -1;
          } while (1 < lVar29);
        }
        uVar37 = uVar37 + 1;
      } while (uVar37 < (ulong)(((long)(n->children).
                                       super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)(n->children).
                                       super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                                       _M_impl.super__Vector_impl_data._M_start >> 4) *
                               -0x5555555555555555));
    }
    goto LAB_0014b302;
  case EndReturn:
    local_78 = "";
    uStack_70 = 0;
LAB_0014adc5:
    pcVar25 = "return ";
    sVar33 = 7;
LAB_0014addb:
    prefix_02.size_ = sVar33;
    prefix_02.data_ = pcVar25;
    WrapNAry(local_110,this,&local_138,prefix_02,(string_view)ZEXT816(0x1ab201),None);
    goto LAB_0014b302;
  case Decl:
    if (((n->u).var)->type_ != Name) {
LAB_0014c3ea:
      __assert_fail("is_name()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir.h",
                    0x39,"const std::string &wabt::Var::name() const");
    }
    pmVar18 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>_>
              ::operator[](&this->cur_ast->vars_defined,&(((n->u).var)->field_2).name_);
    pmVar18->defined = true;
    pVVar6 = (n->u).var;
    if (pVVar6->type_ != Name) goto LAB_0014c3ea;
    paVar20 = &local_108.field_2;
    pcVar7 = (pVVar6->field_2).name_._M_dataplus._M_p;
    local_108._M_dataplus._M_p = (pointer)paVar20;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,pcVar7,pcVar7 + (pVVar6->field_2).name_._M_string_length);
    TVar16 = Func::GetLocalType(this->cur_func,(n->u).var);
    LocalDecl((string *)&local_168,this,&local_108,TVar16);
    plVar17 = (long *)std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,0x1ab897);
    paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar17 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar17 == paVar22) {
      local_198._16_8_ = paVar22->_M_allocated_capacity;
      local_198._24_8_ = plVar17[3];
      local_198._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_198 + 0x10);
    }
    else {
      local_198._16_8_ = paVar22->_M_allocated_capacity;
      local_198._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar17;
    }
    local_198._8_8_ = plVar17[1];
    *plVar17 = (long)paVar22;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    local_38 = 0;
    local_48 = 0;
    uStack_40 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               local_198);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_48);
    __return_storage_ptr___00->precedence = None;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_198 + 0x10)) {
      operator_delete((void *)local_198._0_8_);
    }
    _Var31._M_p = local_108._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168.data_ != &local_158) {
      operator_delete(local_168.data_);
      _Var31._M_p = local_108._M_dataplus._M_p;
    }
    goto LAB_0014b2f8;
  case DeclInit:
    if (((n->u).var)->type_ != Name) goto LAB_0014c3ea;
    pmVar18 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>_>
              ::operator[](&this->cur_ast->vars_defined,&(((n->u).var)->field_2).name_);
    pDVar26 = (Decompiler *)
              local_138.
              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (pmVar18->defined == true) {
      if (((n->u).var)->type_ != Name) goto LAB_0014c3ea;
      local_168 = VarName(this,*(string_view *)&((n->u).var)->field_2);
      cat<wabt::string_view,char[4]>
                ((string *)local_198,(wabt *)&local_168,(string_view *)0x1ab1ea,(char (*) [4])args_1
                );
      local_88 = "";
      uStack_80 = 0;
      uVar28 = 0x1ab201;
      uVar42 = 0;
      PVar35 = None;
      goto LAB_0014afcb;
    }
    pVVar6 = (n->u).var;
    if (pVVar6->type_ != Name) goto LAB_0014c3ea;
    pcVar7 = (pVVar6->field_2).name_._M_dataplus._M_p;
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,pcVar7,pcVar7 + (pVVar6->field_2).name_._M_string_length);
    TVar16 = Func::GetLocalType(this->cur_func,(n->u).var);
    LocalDecl((string *)&local_168,this,&local_108,TVar16);
    cat<char[5],std::__cxx11::string,char[4]>
              ((string *)local_198,(wabt *)"var ",(char (*) [5])&local_168,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1ab1ea,in_R8);
    prefix_00.size_ = local_198._8_8_;
    prefix_00.data_ = (char *)local_198._0_8_;
    local_98 = "";
    uStack_90 = 0;
    WrapChild(__return_storage_ptr___00,this,(Value *)pDVar26,prefix_00,
              (string_view)ZEXT816(0x1ab201),None);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_198 + 0x10)) {
      operator_delete((void *)local_198._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168.data_ != &local_158) {
      operator_delete(local_168.data_);
    }
    _Var31._M_p = local_108._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p == &local_108.field_2) goto LAB_0014b302;
    goto LAB_0014b2fd;
  }
  EVar2 = n->etype;
  switch(EVar2) {
  case Binary:
    if (n->e->type_ != Binary) {
      pcVar25 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::OpcodeExpr<wabt::ExprType::Binary>, Base = wabt::Expr]"
      ;
LAB_0014c5ce:
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/cast.h"
                    ,0x48,pcVar25);
    }
    OpcodeToToken_abi_cxx11_((string *)local_198,this,(Opcode)*(Enum *)&n->e->field_0x3c);
    iVar15 = std::__cxx11::string::compare((char *)local_198);
    PVar35 = Multiply;
    if (((iVar15 != 0) && (iVar15 = std::__cxx11::string::compare(local_198), iVar15 != 0)) &&
       (iVar15 = std::__cxx11::string::compare(local_198), iVar15 != 0)) {
      iVar15 = std::__cxx11::string::compare(local_198);
      PVar35 = Add;
      if ((iVar15 != 0) && (iVar15 = std::__cxx11::string::compare(local_198), iVar15 != 0)) {
        iVar15 = std::__cxx11::string::compare(local_198);
        PVar35 = Bit;
        if ((iVar15 != 0) &&
           ((iVar15 = std::__cxx11::string::compare(local_198), iVar15 != 0 &&
            (iVar15 = std::__cxx11::string::compare(local_198), iVar15 != 0)))) {
          iVar15 = std::__cxx11::string::compare(local_198);
          if (iVar15 != 0) {
            iVar15 = std::__cxx11::string::compare(local_198);
            PVar35 = OtherBin;
            if (iVar15 != 0) goto LAB_0014b12b;
          }
          PVar35 = Shift;
        }
      }
    }
LAB_0014b12b:
    cat<char[2],std::__cxx11::string,char[2]>
              ((string *)&local_168,(wabt *)0x1ab2fe,(char (*) [2])local_198,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1ab2fe,
               (char (*) [2])in_R8);
    WrapBinary(__return_storage_ptr___00,this,&local_138,local_168,false,PVar35);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168.data_ != &local_158) {
      operator_delete(local_168.data_);
    }
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_198 + 0x10);
    goto LAB_0014bd09;
  case Block:
    pEVar21 = n->e;
    if (pEVar21->type_ != Block) {
      pcVar25 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Block>, Base = wabt::Expr]"
      ;
      goto LAB_0014c5ce;
    }
    name_00.data_ = (char *)pEVar21[1]._vptr_Expr;
    name_00.size_ = (size_type)pEVar21[1].super_intrusive_list_base<wabt::Expr>.next_;
    local_168 = VarName(this,name_00);
    cat<char[7],wabt::string_view,char[2]>
              ((string *)local_198,(wabt *)"label ",(char (*) [7])&local_168,(string_view *)":",
               (char (*) [2])&local_168);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
               (string *)local_198);
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_198 + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ != paVar20) {
      operator_delete((void *)local_198._0_8_);
    }
    if (((((local_140 != (Decompiler *)0x0) && (*(NodeType *)&(local_140->mc).module != Statements))
         && (EVar2 = *(ExprType *)((long)&(local_140->mc).module + 4), EVar2 != Block)) &&
        (EVar2 != Loop)) &&
       ((EVar2 != If ||
        ((local_140->mc).label_stack_.super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>.
         _M_impl.super__Vector_impl_data._M_start == (pointer)n)))) {
      IndentValue(this,child,this->indent_amount,(string_view)ZEXT816(0));
      cVar11._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((ModuleContext *)&child->v)->module;
      local_198._0_8_ = paVar20;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"{","");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_insert_rval(&child->v,cVar11,(value_type *)local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._0_8_ != paVar20) {
        operator_delete((void *)local_198._0_8_);
      }
      local_198._0_8_ = paVar20;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"}","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._0_8_ != paVar20) {
        operator_delete((void *)local_198._0_8_);
      }
    }
    PVar35 = Atomic;
    *(undefined4 *)
     &(((ModuleContext *)&child->v)->label_stack_).
      super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.super__Vector_impl_data.
      _M_finish = 10;
    (__return_storage_ptr___00->v).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)((ModuleContext *)&child->v)->module;
    (__return_storage_ptr___00->v).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((intrusive_list_base<wabt::Expr> *)&((ModuleContext *)&child->v)->current_func_)
                  ->next_;
    (__return_storage_ptr___00->v).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         &((((ModuleContext *)&child->v)->label_stack_).
           super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
           super__Vector_impl_data._M_start)->name;
    ((ModuleContext *)&child->v)->module = (Module *)0x0;
    ((intrusive_list_base<wabt::Expr> *)&((ModuleContext *)&child->v)->current_func_)->next_ =
         (Expr *)0x0;
    (((ModuleContext *)&child->v)->label_stack_).
    super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    goto LAB_0014bf56;
  case Br:
    pEVar21 = n->e;
    if (pEVar21->type_ != Br) {
      pcVar25 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::Br>, Base = wabt::Expr]"
      ;
      goto LAB_0014c5ce;
    }
    if ((int)pEVar21[1].loc.filename.size_ != 1) goto LAB_0014c3ea;
    pcVar25 = "goto ";
    if ((n->u).field_0.var_start == 2) {
      pcVar25 = "continue ";
    }
    sVar41 = VarName(this,(string_view)pEVar21[1].loc.field_1);
    y.size_ = (size_type)in_R8;
    y.data_ = (char *)sVar41.size_;
    operator+[abi_cxx11_((string *)local_198,(wabt *)pcVar25,sVar41.data_,y);
    local_168 = (string_view)ZEXT816(0);
    local_158._M_allocated_capacity = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
               (string *)local_198,local_178);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_168);
    __return_storage_ptr___00->precedence = None;
    goto LAB_0014af13;
  case BrIf:
    pEVar21 = n->e;
    if (pEVar21->type_ != BrIf) {
      pcVar25 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::BrIf>, Base = wabt::Expr]"
      ;
      goto LAB_0014c5ce;
    }
    local_108._M_dataplus._M_p = "goto";
    if ((n->u).field_0.var_start == 2) {
      local_108._M_dataplus._M_p = "continue";
    }
    if ((int)pEVar21[1].loc.filename.size_ != 1) goto LAB_0014c3ea;
    local_168 = VarName(this,(string_view)pEVar21[1].loc.field_1);
    cat<char[3],char_const*,char[2],wabt::string_view>
              ((string *)local_198,(wabt *)") ",(char (*) [3])&local_108,(char **)0x1ab2fe,
               (char (*) [2])&local_168,in_R9);
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_198._0_8_;
    pbStack_50 = (pointer)local_198._8_8_;
    postfix_00.size_._0_4_ = (int)local_198._8_8_;
    postfix_00.data_ = (char *)local_198._0_8_;
    postfix_00.size_._4_4_ = SUB84(local_198._8_8_,4);
    prefix_04.size_ = 4;
    prefix_04.data_ = "if (";
    WrapChild(__return_storage_ptr___00,this,child,prefix_04,postfix_00,None);
    goto LAB_0014afd3;
  default:
    local_198._0_8_ = local_198 + 0x10;
    local_198._8_8_ = (pointer)0x0;
    local_198._16_8_ = local_198._16_8_ & 0xffffffffffffff00;
    if ((int)EVar2 < 0x1a) {
      if (EVar2 != Call) {
        if (EVar2 != CallIndirect) {
          if (EVar2 == Convert) {
            pEVar21 = n->e;
            if (pEVar21->type_ != Convert) {
              pcVar25 = 
              "const Derived *wabt::cast(const Base *) [Derived = wabt::OpcodeExpr<wabt::ExprType::Convert>, Base = wabt::Expr]"
              ;
              goto LAB_0014c5ce;
            }
            goto LAB_0014c22a;
          }
          goto switchD_0014baae_caseD_1b;
        }
        pcVar25 = "call_indirect";
        goto LAB_0014c361;
      }
      if (n->e->type_ != Call) {
        pcVar25 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::Call>, Base = wabt::Expr]"
        ;
        goto LAB_0014c5ce;
      }
      if ((int)n->e[1].loc.filename.size_ != 1) goto LAB_0014c3ea;
      std::__cxx11::string::_M_assign((string *)local_198);
    }
    else {
      switch(EVar2) {
      case MemoryCopy:
        pcVar25 = "memory_copy";
        break;
      case MemoryFill:
        pcVar25 = "memory_fill";
        break;
      case MemoryGrow:
        pcVar25 = "memory_grow";
        break;
      case MemorySize:
        pcVar25 = "memory_size";
        break;
      case RefIsNull:
        pcVar25 = "is_null";
        break;
      case ReturnCall:
        pEVar21 = n->e;
        if (pEVar21->type_ != ReturnCall) {
          pcVar25 = 
          "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::ReturnCall>, Base = wabt::Expr]"
          ;
          goto LAB_0014c5ce;
        }
        if ((int)pEVar21[1].loc.filename.size_ != 1) goto LAB_0014c3ea;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_168,"return_call ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pEVar21[1].loc.field_1.field_0);
        std::__cxx11::string::operator=((string *)local_198,(string *)&local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168.data_ != &local_158) {
          operator_delete(local_168.data_);
        }
        PVar35 = None;
        goto LAB_0014c36b;
      case ReturnCallIndirect:
        pcVar25 = "return_call call_indirect";
        break;
      case Select:
        pcVar25 = "select_if";
        break;
      default:
        if (EVar2 == Ternary) {
          pEVar21 = n->e;
          if (pEVar21->type_ != Ternary) {
            pcVar25 = 
            "const Derived *wabt::cast(const Base *) [Derived = wabt::OpcodeExpr<wabt::ExprType::Ternary>, Base = wabt::Expr]"
            ;
            goto LAB_0014c5ce;
          }
LAB_0014c22a:
          OpcodeToToken_abi_cxx11_((string *)&local_168,this,(Opcode)*(Enum *)&pEVar21->field_0x3c);
          std::__cxx11::string::operator=((string *)local_198,(string *)&local_168);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168.data_ != &local_158) {
            operator_delete(local_168.data_);
          }
          goto LAB_0014c366;
        }
      case DataDrop:
      case MemoryInit:
      case Nop:
      case RefFunc:
      case RefNull:
      case Rethrow:
      case Return:
switchD_0014baae_caseD_1b:
        pcVar25 = GetExprTypeName(EVar2);
      }
LAB_0014c361:
      std::__cxx11::string::operator=((string *)local_198,pcVar25);
    }
LAB_0014c366:
    PVar35 = Atomic;
LAB_0014c36b:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_168,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                   "(");
    local_e8 = ")";
    uStack_e0 = 1;
    postfix_01.size_._0_4_ = 1;
    postfix_01.data_ = ")";
    postfix_01.size_._4_4_ = 0;
    WrapNAry(__return_storage_ptr___00,this,&local_138,local_168,postfix_01,PVar35);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168.data_ != &local_158) {
LAB_0014c3d2:
      operator_delete(local_168.data_);
    }
LAB_0014c3d7:
    _Var31._M_p = (pointer)local_198._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_198 + 0x10)) break;
    goto LAB_0014b2fd;
  case BrTable:
    pDVar26 = (Decompiler *)n->e;
    if (*(ExprType *)&pDVar26->target_exp_width != BrTable) {
      pcVar25 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::BrTableExpr, Base = wabt::Expr]";
      goto LAB_0014c5ce;
    }
    local_198._0_8_ = local_198 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"br_table[","");
    pFVar38 = pDVar26->cur_func;
    pFVar10 = (Func *)pDVar26->cur_ast;
    local_140 = pDVar26;
    if (pFVar38 != pFVar10) {
      do {
        if (*(int *)&pFVar38->decl != 1) goto LAB_0014c3ea;
        sVar41 = VarName(this,(pFVar38->decl).type_var.loc.filename);
        std::__cxx11::string::append(local_198,(ulong)sVar41.data_);
        std::__cxx11::string::append(local_198);
        pFVar38 = (Func *)&(pFVar38->decl).type_var.type_;
      } while (pFVar38 != pFVar10);
    }
    std::__cxx11::string::append(local_198);
    if ((int)(local_140->lst).vars._M_t._M_impl.super__Rb_tree_header._M_node_count != 1)
    goto LAB_0014c3ea;
    name.data_ = (char *)local_140[1].mc.module;
    name.size_ = (size_type)local_140[1].mc.current_func_;
    sVar41 = VarName(this,name);
    std::__cxx11::string::append(local_198,(ulong)sVar41.data_);
    std::__cxx11::string::append(local_198);
    local_d8 = ")";
    uStack_d0 = 1;
    uVar28 = 0x1ad36f;
    uVar42 = 1;
    PVar35 = Atomic;
    pDVar26 = (Decompiler *)
              local_138.
              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
              _M_impl.super__Vector_impl_data._M_start;
LAB_0014afcb:
    postfix.size_._0_4_ = uVar42;
    postfix.data_ = (char *)(ulong)uVar28;
    postfix.size_._4_4_ = 0;
    prefix_03.size_ = local_198._8_8_;
    prefix_03.data_ = (char *)local_198._0_8_;
    WrapChild(__return_storage_ptr___00,this,(Value *)pDVar26,prefix_03,postfix,PVar35);
    goto LAB_0014afd3;
  case Compare:
    if (n->e->type_ != Compare) {
      pcVar25 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::OpcodeExpr<wabt::ExprType::Compare>, Base = wabt::Expr]"
      ;
      goto LAB_0014c5ce;
    }
    OpcodeToToken_abi_cxx11_((string *)&local_168,this,(Opcode)*(Enum *)&n->e->field_0x3c);
    cat<char[2],std::__cxx11::string,char[2]>
              ((string *)local_198,(wabt *)0x1ab2fe,(char (*) [2])&local_168,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1ab2fe,
               (char (*) [2])in_R8);
    infix.size_ = local_198._8_8_;
    infix.data_ = (char *)local_198._0_8_;
    WrapBinary(__return_storage_ptr___00,this,&local_138,infix,false,Equal);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_198 + 0x10)) goto LAB_0014bd04;
LAB_0014bcff:
    operator_delete((void *)local_198._0_8_);
    goto LAB_0014bd04;
  case Const:
    pEVar21 = n->e;
    if (pEVar21->type_ != Const) {
      pcVar25 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::ConstExpr, Base = wabt::Expr]";
      goto LAB_0014c5ce;
    }
    switch((int)pEVar21[1].loc.filename.size_) {
    case -5:
      pcVar30 = "V128";
      pcVar25 = "";
      goto LAB_0014bad6;
    case -4:
      to_string_abi_cxx11_((string *)local_198,this,(double)pEVar21[1].loc.field_1.field_1.offset);
      goto LAB_0014aed7;
    case -3:
      to_string_abi_cxx11_((string *)&local_168,this,(double)*(float *)&pEVar21[1].loc.field_1);
      break;
    case -2:
      std::__cxx11::to_string((string *)&local_168,pEVar21[1].loc.field_1.field_1.offset);
      break;
    case -1:
      std::__cxx11::to_string((string *)local_198,pEVar21[1].loc.field_1.field_0.line);
      local_168 = (string_view)ZEXT816(0);
      local_158._M_allocated_capacity = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
                 (string *)local_198,local_178);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&__return_storage_ptr___00->v,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_168);
      __return_storage_ptr___00->precedence = Atomic;
      goto LAB_0014af13;
    default:
      abort();
    }
    puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar19 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar19 == paVar20) {
      local_198._16_8_ = paVar20->_M_allocated_capacity;
      local_198._24_8_ = puVar19[3];
      local_198._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_198 + 0x10);
    }
    else {
      local_198._16_8_ = paVar20->_M_allocated_capacity;
      local_198._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar19;
    }
    local_198._8_8_ = puVar19[1];
    *puVar19 = paVar20;
    puVar19[1] = 0;
    *(undefined1 *)(puVar19 + 2) = 0;
    local_108.field_2._M_allocated_capacity = 0;
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
               local_198);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_108);
    __return_storage_ptr___00->precedence = Atomic;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_198 + 0x10)) goto LAB_0014bcff;
    goto LAB_0014bd04;
  case Drop:
    goto switchD_0014b00c_caseD_11;
  case GlobalGet:
    if ((((VarExpr<(wabt::ExprType)18> *)n->e)->super_ExprMixin<(wabt::ExprType)18>).super_Expr.
        type_ != GlobalGet) {
      pcVar25 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::GlobalGet>, Base = wabt::Expr]"
      ;
      goto LAB_0014c5ce;
    }
    Get<(wabt::ExprType)18>(local_110,this,(VarExpr<(wabt::ExprType)18> *)n->e);
    break;
  case GlobalSet:
    if ((((VarExpr<(wabt::ExprType)19> *)n->e)->super_ExprMixin<(wabt::ExprType)19>).super_Expr.
        type_ != GlobalSet) {
      pcVar25 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::GlobalSet>, Base = wabt::Expr]"
      ;
      goto LAB_0014c5ce;
    }
    Set<(wabt::ExprType)19>
              (local_110,this,
               local_138.
               super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
               ._M_impl.super__Vector_impl_data._M_start,(VarExpr<(wabt::ExprType)19> *)n->e);
    break;
  case If:
    if (n->e->type_ != If) {
      pcVar25 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::IfExpr, Base = wabt::Expr]";
      goto LAB_0014c5ce;
    }
    sVar8 = n->e[4].loc.field_1.field_1.offset;
    val = (Value *)((long)local_138.
                          super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0x40);
    if (sVar8 == 0) {
      val = (Value *)0x0;
    }
    pMVar23 = ((ModuleContext *)
              &(local_138.
                super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                ._M_impl.super__Vector_impl_data._M_start)->v)->module;
    pMVar9 = (Module *)
             ((intrusive_list_base<wabt::Expr> *)
             &((ModuleContext *)
              &(local_138.
                super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                ._M_impl.super__Vector_impl_data._M_start)->v)->current_func_)->next_;
    bVar40 = true;
    if ((ulong)((long)pMVar9 - (long)pMVar23) < 0x21) {
      bVar40 = 0x20 < (ulong)((long)((anon_union_8_3_69560e6a_for_u *)
                                    &(((anon_union_16_2_ecfd7102_for_Location_1 *)
                                      ((long)local_138.
                                             super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                                             ._M_impl.super__Vector_impl_data._M_start + 0x28))->
                                     field_1).offset)->var -
                             (long)(((ModuleContext *)
                                    &(local_138.
                                      super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->v)->label_stack_).
                                   super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    pEVar21 = (Expr *)0x0;
    for (; pMVar23 != pMVar9; pMVar23 = (Module *)&pMVar23->name) {
      pEVar24 = ((intrusive_list_base<wabt::Expr> *)&(pMVar23->loc).filename.size_)->next_;
      if (pEVar21 <= pEVar24) {
        pEVar21 = pEVar24;
      }
    }
    pEVar24 = (Expr *)0x0;
    pLVar34 = (((ModuleContext *)
               &(local_138.
                 super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                 ._M_impl.super__Vector_impl_data._M_start)->v)->label_stack_).
              super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    for (pLVar32 = pLVar34;
        pLVar32 !=
        (pointer)((anon_union_8_3_69560e6a_for_u *)
                 &(((anon_union_16_2_ecfd7102_for_Location_1 *)
                   ((long)local_138.
                          super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0x28))->field_1).offset)->var;
        pLVar32 = (pointer)&pLVar32->label_type) {
      pEVar12 = (Expr *)(pLVar32->name)._M_string_length;
      if (pEVar24 <= pEVar12) {
        pEVar24 = pEVar12;
      }
    }
    uVar37 = (long)&pEVar24->_vptr_Expr + (long)pEVar21;
    if (sVar8 != 0) {
      pbVar13 = (val->v).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar27 = 0;
      pbVar39 = (val->v).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      for (pbVar36 = pbVar39; pbVar36 != pbVar13; pbVar36 = pbVar36 + 1) {
        if (uVar27 <= pbVar36->_M_string_length) {
          uVar27 = pbVar36->_M_string_length;
        }
      }
      uVar37 = uVar27 + uVar37;
      if (bVar40) {
        bVar40 = true;
      }
      else {
        bVar40 = 0x20 < (ulong)((long)pbVar13 - (long)pbVar39);
      }
    }
    if ((bVar40) || (this->target_exp_width < uVar37)) {
      pMVar14 = (ModuleContext *)
                &(local_138.
                  super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                  ._M_impl.super__Vector_impl_data._M_start)->v;
      first_indent.size_ = 4;
      first_indent.data_ = "if (";
      IndentValue(this,local_138.
                       super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                       ._M_impl.super__Vector_impl_data._M_start,4,first_indent);
      std::__cxx11::string::append
                ((char *)&((intrusive_list_base<wabt::Expr> *)
                          &((ModuleContext *)&child->v)->current_func_)->next_[-1].loc.filename.
                          size_);
      local_140 = this;
      IndentValue(this,(Value *)&(pMVar14->label_stack_).
                                 super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                  this->indent_amount,(string_view)ZEXT816(0));
      pLVar34 = (((ModuleContext *)&child->v)->label_stack_).
                super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      lVar29 = (long)((anon_union_8_3_69560e6a_for_u *)
                     &(((anon_union_16_2_ecfd7102_for_Location_1 *)((long)child + 0x28))->field_1).
                      offset)->var - (long)pLVar34 >> 5;
      if (0 < lVar29) {
        lVar29 = lVar29 + 1;
        do {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
                     &pLVar34->name);
          pLVar34 = (pointer)&pLVar34->label_type;
          lVar29 = lVar29 + -1;
        } while (1 < lVar29);
      }
      if (sVar8 != 0) {
        local_198._0_8_ = (pointer)(local_198 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"} else {","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
        if ((pointer)local_198._0_8_ != (pointer)(local_198 + 0x10)) {
          operator_delete((void *)local_198._0_8_);
        }
        IndentValue(local_140,val,local_140->indent_amount,(string_view)ZEXT816(0));
        pbVar39 = (val->v).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar29 = (long)(val->v).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar39 >> 5;
        if (0 < lVar29) {
          lVar29 = lVar29 + 1;
          do {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
                       pbVar39);
            pbVar39 = pbVar39 + 1;
            lVar29 = lVar29 + -1;
          } while (1 < lVar29);
        }
      }
      local_198._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_198 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"}","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_198 + 0x10)) {
        operator_delete((void *)local_198._0_8_);
      }
      PVar35 = If;
      goto LAB_0014bf2d;
    }
    cat<char[5],std::__cxx11::string,char[5],std::__cxx11::string,char[3]>
              ((string *)local_198,(wabt *)"if (",
               (char (*) [5])
               ((ModuleContext *)
               &(local_138.
                 super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                 ._M_impl.super__Vector_impl_data._M_start)->v)->module,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)") { ",
               (char (*) [5])pLVar34,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" }",
               (char (*) [3])CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    if (sVar8 != 0) {
      cat<char[9],std::__cxx11::string,char[3]>
                ((string *)&local_168,(wabt *)" else { ",
                 (char (*) [9])
                 (val->v).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" }",
                 (char (*) [3])pLVar34);
      std::__cxx11::string::_M_append(local_198,(ulong)local_168.data_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168.data_ != &local_158) {
        operator_delete(local_168.data_);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_198 + 0x10)) {
      local_158._8_8_ = local_198._24_8_;
      local_198._0_8_ = &local_158;
    }
    local_158._M_allocated_capacity = local_198._16_8_;
    local_168.size_ = local_198._8_8_;
    local_168.data_ = (char *)local_198._0_8_;
    local_198._8_8_ = (pointer)0x0;
    local_198._16_8_ = local_198._16_8_ & 0xffffffffffffff00;
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    local_198._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_198 + 0x10);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
               (string *)&local_168);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_108);
    __return_storage_ptr___00->precedence = If;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168.data_ != &local_158) goto LAB_0014c3d2;
    goto LAB_0014c3d7;
  case Load:
    pEVar21 = n->e;
    if (pEVar21->type_ != Load) {
      pcVar25 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::LoadStoreExpr<wabt::ExprType::Load>, Base = wabt::Expr]"
      ;
      goto LAB_0014c5ce;
    }
    local_140 = (Decompiler *)
                local_138.
                super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_118 = (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
                super__Vector_impl_data._M_start;
    uVar28 = *(uint *)((long)&pEVar21[1]._vptr_Expr + 4);
    OVar3.enum_ = *(Enum *)&pEVar21->field_0x3c;
    AVar4 = *(Address *)&pEVar21[1]._vptr_Expr;
    Opcode::GetInfo((Opcode *)&pEVar21->field_0x3c);
    LoadStore(this,(Value *)local_140,local_118,(ulong)uVar28,OVar3,AVar4,(Type)local_198._16_4_);
    goto switchD_0014b00c_caseD_11;
  case LocalGet:
    if ((((VarExpr<(wabt::ExprType)22> *)n->e)->super_ExprMixin<(wabt::ExprType)22>).super_Expr.
        type_ != LocalGet) {
      pcVar25 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::LocalGet>, Base = wabt::Expr]"
      ;
      goto LAB_0014c5ce;
    }
    Get<(wabt::ExprType)22>(local_110,this,(VarExpr<(wabt::ExprType)22> *)n->e);
    break;
  case LocalSet:
    if ((((VarExpr<(wabt::ExprType)23> *)n->e)->super_ExprMixin<(wabt::ExprType)23>).super_Expr.
        type_ != LocalSet) {
      pcVar25 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::LocalSet>, Base = wabt::Expr]"
      ;
      goto LAB_0014c5ce;
    }
    Set<(wabt::ExprType)23>
              (local_110,this,
               local_138.
               super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
               ._M_impl.super__Vector_impl_data._M_start,(VarExpr<(wabt::ExprType)23> *)n->e);
    break;
  case LocalTee:
    ve = (VarExpr<(wabt::ExprType)24> *)n->e;
    if ((ve->super_ExprMixin<(wabt::ExprType)24>).super_Expr.type_ != LocalTee) {
      pcVar25 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::LocalTee>, Base = wabt::Expr]"
      ;
      goto LAB_0014c5ce;
    }
    if (local_138.
        super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_138.
        super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      Get<(wabt::ExprType)24>(local_110,this,ve);
    }
    else {
      Set<(wabt::ExprType)24>
                (local_110,this,
                 local_138.
                 super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                 ._M_impl.super__Vector_impl_data._M_start,ve);
    }
    break;
  case Loop:
    pEVar21 = n->e;
    if (pEVar21->type_ != Loop) {
      pcVar25 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Loop>, Base = wabt::Expr]"
      ;
      goto LAB_0014c5ce;
    }
    IndentValue(this,local_138.
                     super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                     ._M_impl.super__Vector_impl_data._M_start,this->indent_amount,
                (string_view)ZEXT816(0));
    cVar11._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((ModuleContext *)&child->v)->module;
    name_01.data_ = (char *)pEVar21[1]._vptr_Expr;
    name_01.size_ = (size_type)pEVar21[1].super_intrusive_list_base<wabt::Expr>.next_;
    local_168 = VarName(this,name_01);
    cat<char[6],wabt::string_view,char[3]>
              ((string *)local_198,(wabt *)"loop ",(char (*) [6])&local_168,(string_view *)0x1aa274,
               (char (*) [3])&local_168);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_rval(&child->v,cVar11,(string *)local_198);
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_198 + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ != paVar20) {
      operator_delete((void *)local_198._0_8_);
    }
    local_198._0_8_ = paVar20;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"}","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ != paVar20) {
      operator_delete((void *)local_198._0_8_);
    }
    PVar35 = Atomic;
LAB_0014bf2d:
    *(Precedence *)
     &(((ModuleContext *)&child->v)->label_stack_).
      super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.super__Vector_impl_data.
      _M_finish = PVar35;
    (__return_storage_ptr___00->v).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)((ModuleContext *)&child->v)->module;
    (__return_storage_ptr___00->v).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((intrusive_list_base<wabt::Expr> *)&((ModuleContext *)&child->v)->current_func_)
                  ->next_;
    (__return_storage_ptr___00->v).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         &((((ModuleContext *)&child->v)->label_stack_).
           super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
           super__Vector_impl_data._M_start)->name;
    ((ModuleContext *)&child->v)->module = (Module *)0x0;
    ((intrusive_list_base<wabt::Expr> *)&((ModuleContext *)&child->v)->current_func_)->next_ =
         (Expr *)0x0;
    (((ModuleContext *)&child->v)->label_stack_).
    super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
LAB_0014bf56:
    __return_storage_ptr___00->precedence = PVar35;
    break;
  case Nop:
    pcVar30 = "nop";
    pcVar25 = "";
    goto LAB_0014bb35;
  case RefNull:
    pcVar30 = "null";
    pcVar25 = "";
LAB_0014bad6:
    local_198._0_8_ = local_198 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,pcVar30,pcVar25);
    local_168 = (string_view)ZEXT816(0);
    local_158._M_allocated_capacity = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
               (string *)local_198,local_178);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_168);
    __return_storage_ptr___00->precedence = Atomic;
    goto LAB_0014bb7b;
  case Rethrow:
    local_c8 = "";
    uStack_c0 = 0;
    pcVar25 = "rethrow ";
    sVar33 = 8;
    goto LAB_0014addb;
  case Return:
    local_b8 = "";
    uStack_b0 = 0;
    goto LAB_0014adc5;
  case Store:
    pEVar21 = n->e;
    if (pEVar21->type_ != Store) {
      pcVar25 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::LoadStoreExpr<wabt::ExprType::Store>, Base = wabt::Expr]"
      ;
      goto LAB_0014c5ce;
    }
    local_140 = (Decompiler *)
                (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_118 = (Node *)(ulong)*(uint *)((long)&pEVar21[1]._vptr_Expr + 4);
    OVar3.enum_ = *(Enum *)&pEVar21->field_0x3c;
    AVar4 = *(Address *)&pEVar21[1]._vptr_Expr;
    Opcode::GetInfo((Opcode *)&pEVar21->field_0x3c);
    LoadStore(this,child,(Node *)local_140,(uint64_t)local_118,OVar3,AVar4,(Type)local_198._24_4_);
    infix_00.size_ = 3;
    infix_00.data_ = " = ";
    WrapBinary(__return_storage_ptr___00,this,&local_138,infix_00,true,Assign);
    break;
  case Unary:
    if (n->e->type_ != Unary) {
      pcVar25 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::OpcodeExpr<wabt::ExprType::Unary>, Base = wabt::Expr]"
      ;
      goto LAB_0014c5ce;
    }
    OpcodeToToken_abi_cxx11_((string *)&local_168,this,(Opcode)*(Enum *)&n->e->field_0x3c);
    puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar19 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar19 == paVar20) {
      local_198._16_8_ = paVar20->_M_allocated_capacity;
      local_198._24_8_ = puVar19[3];
      local_198._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_198 + 0x10);
    }
    else {
      local_198._16_8_ = paVar20->_M_allocated_capacity;
      local_198._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar19;
    }
    local_198._8_8_ = puVar19[1];
    *puVar19 = paVar20;
    puVar19[1] = 0;
    *(undefined1 *)(puVar19 + 2) = 0;
    prefix_01.size_ = local_198._8_8_;
    prefix_01.data_ = (char *)local_198._0_8_;
    local_a8 = ")";
    uStack_a0 = 1;
    sVar41.size_._0_4_ = 1;
    sVar41.data_ = ")";
    sVar41.size_._4_4_ = 0;
    WrapChild(__return_storage_ptr___00,this,child,prefix_01,sVar41,Atomic);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_198 + 0x10)) goto LAB_0014bcff;
LAB_0014bd04:
    paVar20 = &local_158;
LAB_0014bd09:
    _Var31._M_p = *(pointer *)(paVar20->_M_local_buf + -0x10);
LAB_0014afd8:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var31._M_p != paVar20) {
LAB_0014b2fd:
      operator_delete(_Var31._M_p);
    }
    break;
  case Last:
    pcVar30 = "unreachable";
    pcVar25 = "";
LAB_0014bb35:
    local_198._0_8_ = local_198 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,pcVar30,pcVar25);
    local_168 = (string_view)ZEXT816(0);
    local_158._M_allocated_capacity = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
               (string *)local_198,local_178);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_168);
    __return_storage_ptr___00->precedence = None;
LAB_0014bb7b:
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_198 + 0x10);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_168);
    _Var31._M_p = (pointer)local_198._0_8_;
LAB_0014b2f8:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var31._M_p == paVar20) break;
    goto LAB_0014b2fd;
  }
LAB_0014b302:
  std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::~vector
            (&local_138);
  return __return_storage_ptr___00;
switchD_0014b00c_caseD_11:
  (__return_storage_ptr___00->v).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ModuleContext *)
                &(local_138.
                  super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                  ._M_impl.super__Vector_impl_data._M_start)->v)->module;
  (__return_storage_ptr___00->v).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((intrusive_list_base<wabt::Expr> *)
                &((ModuleContext *)
                 &(local_138.
                   super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                   ._M_impl.super__Vector_impl_data._M_start)->v)->current_func_)->next_;
  (__return_storage_ptr___00->v).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       &((((ModuleContext *)
          &(local_138.
            super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
            _M_impl.super__Vector_impl_data._M_start)->v)->label_stack_).
         super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
         super__Vector_impl_data._M_start)->name;
  ((ModuleContext *)
  &(local_138.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
    _M_impl.super__Vector_impl_data._M_start)->v)->module = (Module *)0x0;
  ((intrusive_list_base<wabt::Expr> *)
  &((ModuleContext *)
   &(local_138.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
     ._M_impl.super__Vector_impl_data._M_start)->v)->current_func_)->next_ = (Expr *)0x0;
  (((ModuleContext *)
   &(local_138.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
     ._M_impl.super__Vector_impl_data._M_start)->v)->label_stack_).
  super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  PVar35 = *(Precedence *)
            &(((ModuleContext *)
              &(local_138.
                super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                ._M_impl.super__Vector_impl_data._M_start)->v)->label_stack_).
             super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
             super__Vector_impl_data._M_finish;
  goto LAB_0014bf56;
}

Assistant:

Value DecompileExpr(const Node& n, const Node* parent) {
    std::vector<Value> args;
    for (auto& c : n.children) {
      args.push_back(DecompileExpr(c, &n));
    }
    // First deal with the specialized node types.
    switch (n.ntype) {
      case NodeType::FlushToVars: {
        std::string decls = "let ";
        for (Index i = 0; i < n.u.var_count; i++) {
          if (i) decls += ", ";
          decls += TempVarName(n.u.var_start + i);
        }
        decls += " = ";
        return WrapNAry(args, decls, "", Precedence::Assign);
      }
      case NodeType::FlushedVar: {
        return Value { { TempVarName(n.u.var_start) }, Precedence::Atomic };
      }
      case NodeType::Statements: {
        Value stats { {}, Precedence::None };
        for (size_t i = 0; i < n.children.size(); i++) {
          auto& s = args[i].v.back();
          if (s.back() != '}' && s.back() != ':') s += ';';
          std::move(args[i].v.begin(), args[i].v.end(),
                    std::back_inserter(stats.v));
        }
        return stats;
      }
      case NodeType::EndReturn: {
        return WrapNAry(args, "return ", "", Precedence::None);
      }
      case NodeType::Decl: {
        cur_ast->vars_defined[n.u.var->name()].defined = true;
        return Value{
            {"var " + LocalDecl(std::string(n.u.var->name()),
                                cur_func->GetLocalType(*n.u.var))},
            Precedence::None};
      }
      case NodeType::DeclInit: {
        if (cur_ast->vars_defined[n.u.var->name()].defined) {
          // This has already been pre-declared, output as assign.
          return WrapChild(args[0], cat(VarName(n.u.var->name()), " = "), "",
                           Precedence::None);
        } else {
          return WrapChild(
              args[0],
              cat("var ",
                  LocalDecl(std::string(n.u.var->name()),
                            cur_func->GetLocalType(*n.u.var)),
                  " = "),
              "", Precedence::None);
        }
      }
      case NodeType::Expr:
        // We're going to fall thru to the second switch to deal with ExprType.
        break;
      case NodeType::Uninitialized:
        assert(false);
        break;
    }
    // Existing ExprTypes.
    switch (n.etype) {
      case ExprType::Const: {
        auto& c = cast<ConstExpr>(n.e)->const_;
        switch (c.type()) {
          case Type::I32:
            return Value{{std::to_string(static_cast<int32_t>(c.u32()))},
                         Precedence::Atomic};
          case Type::I64:
            return Value{{std::to_string(static_cast<int64_t>(c.u64())) + "L"},
                         Precedence::Atomic};
          case Type::F32: {
            float f = Bitcast<float>(c.f32_bits());
            return Value{{to_string(f) + "f"}, Precedence::Atomic};
          }
          case Type::F64: {
            double d = Bitcast<double>(c.f64_bits());
            return Value{{to_string(d)}, Precedence::Atomic};
          }
          case Type::V128:
            return Value{{"V128"}, Precedence::Atomic};  // FIXME
          default:
            WABT_UNREACHABLE;
        }
      }
      case ExprType::LocalGet: {
        return Get(*cast<LocalGetExpr>(n.e));
      }
      case ExprType::GlobalGet: {
        return Get(*cast<GlobalGetExpr>(n.e));
      }
      case ExprType::LocalSet: {
        return Set(args[0], *cast<LocalSetExpr>(n.e));
      }
      case ExprType::GlobalSet: {
        return Set(args[0], *cast<GlobalSetExpr>(n.e));
      }
      case ExprType::LocalTee: {
        auto& te = *cast<LocalTeeExpr>(n.e);
        return args.empty() ? Get(te) : Set(args[0], te);
      }
      case ExprType::Binary: {
        auto& be = *cast<BinaryExpr>(n.e);
        auto opcs = OpcodeToToken(be.opcode);
        // TODO: Is this selection better done on Opcode values directly?
        // What if new values get added and OtherBin doesn't make sense?
        auto prec = Precedence::OtherBin;
        if (opcs == "*" || opcs == "/" || opcs == "%") {
          prec = Precedence::Multiply;
        } else if (opcs == "+" || opcs == "-") {
          prec = Precedence::Add;
        } else if (opcs == "&" || opcs == "|" || opcs == "^") {
          prec = Precedence::Bit;
        } else if (opcs == "<<" || opcs == ">>") {
          prec = Precedence::Shift;
        }
        return WrapBinary(args, cat(" ", opcs, " "), false, prec);
      }
      case ExprType::Compare: {
        auto& ce = *cast<CompareExpr>(n.e);
         return WrapBinary(args, cat(" ", OpcodeToToken(ce.opcode), " "), false,
                           Precedence::Equal);
      }
      case ExprType::Unary: {
        auto& ue = *cast<UnaryExpr>(n.e);
        //BracketIfNeeded(stack.back());
        // TODO: also version without () depending on precedence.
        return WrapChild(args[0], OpcodeToToken(ue.opcode) + "(", ")",
                         Precedence::Atomic);
      }
      case ExprType::Load: {
        auto& le = *cast<LoadExpr>(n.e);
        LoadStore(args[0], n.children[0], le.offset, le.opcode, le.align,
                  le.opcode.GetResultType());
        return std::move(args[0]);
      }
      case ExprType::Store: {
        auto& se = *cast<StoreExpr>(n.e);
        LoadStore(args[0], n.children[0], se.offset, se.opcode, se.align,
                  se.opcode.GetParamType2());
        return WrapBinary(args, " = ", true, Precedence::Assign);
      }
      case ExprType::If: {
        auto ife = cast<IfExpr>(n.e);
        Value *elsep = nullptr;
        if (!ife->false_.empty()) {
          elsep = &args[2];
        }
        auto& thenp = args[1];
        auto& ifs = args[0];
        bool multiline = ifs.v.size() > 1 || thenp.v.size() > 1;
        size_t width = ifs.width() + thenp.width();
        if (elsep) {
          width += elsep->width();
          multiline = multiline || elsep->v.size() > 1;
        }
        multiline = multiline || width > target_exp_width;
        if (multiline) {
          auto if_start = string_view("if (");
          IndentValue(ifs, if_start.size(), if_start);
          ifs.v.back() += ") {";
          IndentValue(thenp, indent_amount, {});
          std::move(thenp.v.begin(), thenp.v.end(), std::back_inserter(ifs.v));
          if (elsep) {
            ifs.v.push_back("} else {");
            IndentValue(*elsep, indent_amount, {});
            std::move(elsep->v.begin(), elsep->v.end(), std::back_inserter(ifs.v));
          }
          ifs.v.push_back("}");
          ifs.precedence = Precedence::If;
          return std::move(ifs);
        } else {
          auto s = cat("if (", ifs.v[0], ") { ", thenp.v[0], " }");
          if (elsep)
            s += cat(" else { ", elsep->v[0], " }");
          return Value{{std::move(s)}, Precedence::If};
        }
      }
      case ExprType::Block: {
        auto& val = args[0];
        val.v.push_back(
              cat("label ", VarName(cast<BlockExpr>(n.e)->block.label), ":"));
        // If this block is part of a larger statement scope, it doesn't
        // need its own indenting, but if its part of an exp we wrap it in {}.
        if (parent && parent->ntype != NodeType::Statements
                   && parent->etype != ExprType::Block
                   && parent->etype != ExprType::Loop
                   && (parent->etype != ExprType::If ||
                       &parent->children[0] == &n)) {
          IndentValue(val, indent_amount, {});
          val.v.insert(val.v.begin(), "{");
          val.v.push_back("}");
        }
        val.precedence = Precedence::Atomic;
        return std::move(val);
      }
      case ExprType::Loop: {
        auto& val = args[0];
        auto& block = cast<LoopExpr>(n.e)->block;
        IndentValue(val, indent_amount, {});
        val.v.insert(val.v.begin(), cat("loop ", VarName(block.label), " {"));
        val.v.push_back("}");
        val.precedence = Precedence::Atomic;
        return std::move(val);
      }
      case ExprType::Br: {
        auto be = cast<BrExpr>(n.e);
        return Value{{(n.u.lt == LabelType::Loop ? "continue " : "goto ") +
                      VarName(be->var.name())},
                     Precedence::None};
      }
      case ExprType::BrIf: {
        auto bie = cast<BrIfExpr>(n.e);
        auto jmp = n.u.lt == LabelType::Loop ? "continue" : "goto";
        return WrapChild(args[0], "if (", cat(") ", jmp, " ",
                                              VarName(bie->var.name())),
                         Precedence::None);
      }
      case ExprType::Return: {
        return WrapNAry(args, "return ", "", Precedence::None);
      }
      case ExprType::Rethrow: {
        return WrapNAry(args, "rethrow ", "", Precedence::None);
      }
      case ExprType::Drop: {
        // Silent dropping of return values is very common, so currently
        // don't output this.
        return std::move(args[0]);
      }
      case ExprType::Nop: {
        return Value{{"nop"}, Precedence::None};
      }
      case ExprType::Unreachable: {
        return Value{{"unreachable"}, Precedence::None};
      }
      case ExprType::RefNull: {
        return Value{{"null"}, Precedence::Atomic};
      }
      case ExprType::BrTable: {
        auto bte = cast<BrTableExpr>(n.e);
        std::string ts = "br_table[";
        for (auto &v : bte->targets) {
          ts += VarName(v.name());
          ts += ", ";
        }
        ts += "..";
        ts += VarName(bte->default_target.name());
        ts += "](";
        return WrapChild(args[0], ts, ")", Precedence::Atomic);
      }
      default: {
        // Everything that looks like a function call.
        std::string name;
        auto precedence = Precedence::Atomic;
        switch (n.etype) {
          case ExprType::Call:
            name = cast<CallExpr>(n.e)->var.name();
            break;
          case ExprType::ReturnCall:
            name = "return_call " + cast<ReturnCallExpr>(n.e)->var.name();
            precedence = Precedence::None;
            break;
          case ExprType::Convert:
            name = std::string(OpcodeToToken(cast<ConvertExpr>(n.e)->opcode));
            break;
          case ExprType::Ternary:
            name = std::string(OpcodeToToken(cast<TernaryExpr>(n.e)->opcode));
            break;
          case ExprType::Select:
            // This one looks like it could be translated to "?:" style ternary,
            // but the arguments are NOT lazy, and side effects definitely do
            // occur in the branches. So it has no clear equivalent in C-syntax.
            // To emphasize that all args are being evaluated in order, we
            // leave it as a function call.
            name = "select_if";
            break;
          case ExprType::MemoryGrow:
            name = "memory_grow";
            break;
          case ExprType::MemorySize:
            name = "memory_size";
            break;
          case ExprType::MemoryCopy:
            name = "memory_copy";
            break;
          case ExprType::MemoryFill:
            name = "memory_fill";
            break;
          case ExprType::RefIsNull:
            name = "is_null";
            break;
          case ExprType::CallIndirect:
            name = "call_indirect";
            break;
          case ExprType::ReturnCallIndirect:
            name = "return_call call_indirect";
            break;
          default:
            name = GetExprTypeName(n.etype);
            break;
        }
        return WrapNAry(args, name + "(", ")", precedence);
      }
    }
  }